

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O2

void __thiscall Track::insert(Track *this,int index,Sector *sector)

{
  pointer pSVar1;
  pointer pSVar2;
  exception *this_00;
  
  pSVar1 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pSVar2 - (long)pSVar1) >> 6) < index) {
    __assert_fail("index <= static_cast<int>(m_sectors.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                  ,0x121,"void Track::insert(int, Sector &&)");
  }
  if ((pSVar1 != pSVar2) && (pSVar1->datarate != sector->datarate)) {
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[31]>
              (this_00,(char (*) [31])"can\'t mix datarates on a track");
    __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<Sector,_std::allocator<Sector>_>::_M_insert_rval
            (&this->m_sectors,pSVar1 + index,sector);
  return;
}

Assistant:

void Track::insert(int index, Sector&& sector)
{
    assert(index <= static_cast<int>(m_sectors.size()));

    if (!m_sectors.empty() && m_sectors[0].datarate != sector.datarate)
        throw util::exception("can't mix datarates on a track");

    auto it = m_sectors.begin() + index;
    m_sectors.insert(it, std::move(sector));
}